

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O3

char * generate_arg_str(sm_ref net)

{
  char *__ptr;
  size_t sVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  sm_ref psVar5;
  sm_list plVar6;
  ulong uVar7;
  int param_num;
  ulong uVar8;
  char *local_38;
  
  local_38 = (char *)malloc(4);
  __ptr = (char *)malloc(1);
  if (net->node_type == cod_compound_statement) {
    plVar6 = (net->node).compound_statement.decls;
    *local_38 = '\0';
    if (plVar6 != (sm_list)0x0) {
      uVar8 = 0;
      do {
        psVar5 = plVar6->node;
        iVar2 = (int)uVar8;
        if (psVar5->node_type == cod_declaration) {
          uVar3 = (psVar5->node).declaration.param_num;
          if ((ulong)uVar3 != 0xffffffff) {
            if (iVar2 <= (int)uVar3) {
              uVar7 = (ulong)uVar3 + 1;
              __ptr = (char *)realloc(__ptr,uVar7);
              memset(__ptr + uVar8,0xff,(long)(int)(uVar3 - iVar2));
              uVar8 = uVar7 & 0xffffffff;
            }
            cVar4 = *(char *)((long)&psVar5->node + 100);
LAB_00124fe5:
            __ptr[(int)uVar3] = cVar4;
          }
        }
        else if (psVar5->node_type == cod_array_type_decl) {
          do {
            psVar5 = (psVar5->node).declaration.freeable_complex_type;
          } while (psVar5->node_type == cod_array_type_decl);
          uVar3 = (psVar5->node).declaration.param_num;
          if ((ulong)uVar3 != 0xffffffff) {
            cVar4 = '\b';
            if (iVar2 <= (int)uVar3) {
              uVar7 = (ulong)uVar3 + 1;
              __ptr = (char *)realloc(__ptr,uVar7);
              memset(__ptr + uVar8,0xff,(long)(int)(uVar3 - iVar2));
              uVar8 = uVar7 & 0xffffffff;
            }
            goto LAB_00124fe5;
          }
        }
        uVar3 = (uint)uVar8;
        plVar6 = plVar6->next;
      } while (plVar6 != (list_struct *)0x0);
      if (uVar3 == 1) {
        uVar3 = (uint)(*__ptr != '\v');
      }
      if (0 < (int)uVar3) {
        uVar8 = 0;
        do {
          if (__ptr[uVar8] == -1) {
            printf("Arg %d not declared\n",uVar8 & 0xffffffff);
            return local_38;
          }
          sVar1 = strlen(local_38);
          sVar1 = sVar1 + 8;
          local_38 = (char *)realloc(local_38,sVar1);
          strncat(local_38,"%",sVar1);
          strncat(local_38,arg_type_str_rel + *(int *)(arg_type_str_rel + (long)__ptr[uVar8] * 4),
                  sVar1);
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
    }
  }
  else {
    *local_38 = '\0';
  }
  free(__ptr);
  return local_38;
}

Assistant:

char *
generate_arg_str(sm_ref net)
{
    sm_list decls = NULL;
    char *arg_str = malloc(4);  /* 4 makes valgrind happier */
    signed char *arg_types = malloc(1);
    int arg_count = 0;
    int i;
    if (net->node_type == cod_compound_statement) {
	decls = net->node.compound_statement.decls;
    }
    arg_str[0] = 0;
    while (decls != NULL) {
	sm_ref decl = decls->node;
	
	if (decl->node_type == cod_declaration) {
	    if (decl->node.declaration.param_num != -1) {
		/* parameter */
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = decl->node.declaration.cg_type;
	    }
	} else if (decl->node_type == cod_array_type_decl) {
	    while(decl->node_type == cod_array_type_decl)
		decl = decl->node.array_type_decl.element_ref;
	    if (decl->node.declaration.param_num != -1) {
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = DILL_P;
	    }
	}
	    
	decls = decls->next;
    }
    if ((arg_count == 1) && (arg_types[0] == DILL_V)) {
	arg_count = 0;
    }
    for (i = 0; i < arg_count ; i++) {
	size_t len;
	if (arg_types[i] == -1) {
	    printf("Arg %d not declared\n", i);
	    return arg_str;
	}
	len = strlen(arg_str) + 8;
	arg_str = realloc(arg_str, len);
	strncat(arg_str, "%", len);
	strncat(arg_str, arg_type_str[arg_types[i]], len);
    }
    free(arg_types);
    return arg_str;
}